

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O2

void __thiscall CTPNStmGoto::gen_code(CTPNStmGoto *this,int param_1,int param_2)

{
  CTPNStmLabel *target;
  CTcCodeStream *this_00;
  int iVar1;
  CTcSymbol *pCVar2;
  CTcCodeLabel *lbl;
  CTPNStmEnclosing *enc;
  CTPNStmLabel *pCVar3;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  if ((((G_cs->goto_symtab_ != (CTcPrsSymtab *)0x0) &&
       (pCVar2 = CTcPrsSymtab::find(G_cs->goto_symtab_,(this->super_CTPNStmGotoBase).lbl_,
                                    (this->super_CTPNStmGotoBase).lbl_len_),
       pCVar2 != (CTcSymbol *)0x0)) &&
      (*(int *)&(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 ==
       8)) && (target = (CTPNStmLabel *)
                        pCVar2[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                        _vptr_CVmHashEntry, target != (CTPNStmLabel *)0x0)) {
    pCVar3 = target;
    if (G_cs->enclosing_ == (CTPNStmEnclosing *)0x0) {
      while ((pCVar3 != (CTPNStmLabel *)0x0 &&
             (iVar1 = (*(pCVar3->super_CTPNStmLabelBase).super_CTPNStmEnclosing.super_CTPNStm.
                        super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
                        [0x24])(pCVar3,this,target), iVar1 != 0))) {
        pCVar3 = (CTPNStmLabel *)(pCVar3->super_CTPNStmLabelBase).super_CTPNStmEnclosing.enclosing_;
      }
    }
    else {
      CTPNStmEnclosing::gen_code_unwind_for_goto(G_cs->enclosing_,this,target);
    }
    CTcGenTarg::write_op(G_cg,0x91);
    this_00 = G_cs;
    lbl = CTPNStmLabel::get_goto_label(target);
    CTcCodeStream::write_ofs2(this_00,lbl,0);
    return;
  }
  CTPNStmBase::log_error
            ((CTPNStmBase *)this,0x2d0a,(ulong)(uint)(this->super_CTPNStmGotoBase).lbl_len_,
             (this->super_CTPNStmGotoBase).lbl_);
  return;
}

Assistant:

void CTPNStmGoto::gen_code(int, int)
{
    CTcSymbol *sym;
    CTPNStmLabel *label_stm;
    
    /* add a line record */
    add_debug_line_rec();

    /* 
     *   look up our label symbol in the 'goto' table for the function,
     *   and get the label statement node from the label 
     */
    if (G_cs->get_goto_symtab() == 0
        || (sym = G_cs->get_goto_symtab()->find(lbl_, lbl_len_)) == 0
        || sym->get_type() != TC_SYM_LABEL
        || (label_stm = ((CTcSymLabel *)sym)->get_stm()) == 0)
    {
        /* log an error */
        log_error(TCERR_INVALID_GOTO_LBL, (int)lbl_len_, lbl_);

        /* give up */
        return;
    }

    /*
     *   Tell any enclosing statements to unwind their 'try' blocks for a
     *   transfer to the given label.  We only need to go as far as the
     *   most deeply nested enclosing statement we have in common with the
     *   label, because we'll be transferring control entirely within the
     *   confines of that enclosing statement.  
     */
    if (G_cs->get_enclosing() != 0)
    {
        /* generate the unwinding code */
        G_cs->get_enclosing()->gen_code_unwind_for_goto(this, label_stm);
    }
    else
    {
        CTPNStmEnclosing *enc;
        
        /*
         *   The 'goto' isn't enclosed in any statements.  This means that
         *   we are entering every block that contains the target label.
         *   Some blocks don't allow entering via 'goto', so we must check
         *   at this point to see if any of the enclosing blocks are
         *   problematic. 
         */
        for (enc = label_stm ; enc != 0 ; enc = enc->get_enclosing())
        {
            /* 
             *   make sure we're allowed to enter this statement - if not,
             *   stop scanning, so that we display only one such error 
             */
            if (!enc->check_enter_by_goto(this, label_stm))
                break;
        }
    }

    /* generate a jump to the label */
    G_cg->write_op(OPC_JMP);
    G_cs->write_ofs2(label_stm->get_goto_label(), 0);
}